

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

ggwave_Instance ggwave_init(ggwave_Parameters parameters)

{
  long *plVar1;
  undefined8 *puVar2;
  GGWave *this;
  ggwave_Instance gVar3;
  ulong uVar4;
  undefined8 *puVar5;
  bool bVar6;
  int in_stack_00000028;
  Parameters local_4c;
  
  if ((anonymous_namespace)::g_instances == 0) {
    puVar5 = &(anonymous_namespace)::g_instances;
    gVar3 = 0;
    bVar6 = false;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    puVar2 = &(anonymous_namespace)::g_instances;
    do {
      if (uVar4 == 2) goto LAB_00104d20;
      puVar5 = puVar2 + 1;
      uVar4 = uVar4 + 1;
      plVar1 = puVar2 + 1;
      puVar2 = puVar5;
    } while (*plVar1 != 0);
    bVar6 = 2 < uVar4;
    gVar3 = (int)uVar4 + 1;
  }
  this = (GGWave *)operator_new(0x5b8);
  local_4c.operatingMode = in_stack_00000028;
  GGWave::GGWave(this,&local_4c);
  *puVar5 = this;
  if (bVar6) {
LAB_00104d20:
    gVar3 = -1;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,
              "Failed to create GGWave instance - reached maximum number of instances (%d)\n",4);
    }
  }
  return gVar3;
}

Assistant:

ggwave_Instance ggwave_init(ggwave_Parameters parameters) {
    for (ggwave_Instance id = 0; id < GGWAVE_MAX_INSTANCES; ++id) {
        if (g_instances[id] == nullptr) {
            g_instances[id] = new GGWave({
                parameters.payloadLength,
                parameters.sampleRateInp,
                parameters.sampleRateOut,
                parameters.sampleRate,
                parameters.samplesPerFrame,
                parameters.soundMarkerThreshold,
                parameters.sampleFormatInp,
                parameters.sampleFormatOut,
                parameters.operatingMode});

            return id;
        }
    }

    ggprintf("Failed to create GGWave instance - reached maximum number of instances (%d)\n", GGWAVE_MAX_INSTANCES);

    return -1;
}